

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_objects.hh
# Opt level: O2

void __thiscall
tchecker::make_shared_t<tchecker::intval_t,_unsigned_long,_1UL>::take_reference
          (make_shared_t<tchecker::intval_t,_unsigned_long,_1UL> *this)

{
  integer_array_t iVar1;
  overflow_error *this_00;
  
  iVar1 = (integer_array_t)((long)this[-1].super_intval_t.super_integer_array_t + 1);
  this[-1].super_intval_t.super_integer_array_t = iVar1;
  if (iVar1 != (integer_array_t)0xfffffffffffffffe) {
    return;
  }
  this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
  std::overflow_error::overflow_error(this_00,"reference counter overflow");
  __cxa_throw(this_00,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
}

Assistant:

inline void take_reference(void) const
  {
    refcount_t * refcount = refcount_addr();
    *refcount += 1;
    if (*refcount == REFCOUNT_MAX) // overflow
      throw std::overflow_error("reference counter overflow");
  }